

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

void trace_hotside(jit_State *J,BCIns *pc)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  
  if (((J[-1].penalty[0x3c].pc.ptr32 & 0x6000) == 0) &&
     (*(char *)((ulong)J->L->base[-1].u32.lo + 6) == '\0')) {
    lVar1 = *(long *)((ulong)J->trace[J->parent].gcptr32 + 0x20);
    uVar2 = (uint)*(byte *)(lVar1 + 0xb + (ulong)J->exitno * 0xc);
    if ((uVar2 != 0xff) &&
       (iVar3 = uVar2 + 1, *(char *)(lVar1 + (ulong)J->exitno * 0xc + 0xb) = (char)iVar3,
       J->param[7] <= iVar3)) {
      J->state = LJ_TRACE_START;
      lj_trace_ins(J,pc);
      return;
    }
  }
  return;
}

Assistant:

static void trace_hotside(jit_State *J, const BCIns *pc)
{
  SnapShot *snap = &traceref(J, J->parent)->snap[J->exitno];
  if (!(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT)) &&
      isluafunc(curr_func(J->L)) &&
      snap->count != SNAPCOUNT_DONE &&
      ++snap->count >= J->param[JIT_P_hotexit]) {
    lj_assertJ(J->state == LJ_TRACE_IDLE, "hot side exit while recording");
    /* J->parent is non-zero for a side trace. */
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc);
  }
}